

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O2

int cbb_add_u(CBB *cbb,uint64_t v,size_t len_len)

{
  int iVar1;
  uint8_t *in_RAX;
  ulong uVar2;
  int iVar3;
  uint8_t *buf;
  
  buf = in_RAX;
  iVar1 = CBB_add_space(cbb,&buf,len_len);
  iVar3 = 0;
  if (iVar1 != 0) {
    for (uVar2 = len_len - 1; uVar2 < len_len; uVar2 = uVar2 - 1) {
      buf[uVar2] = (uint8_t)v;
      v = v >> 8;
    }
    if (v == 0) {
      iVar3 = 1;
    }
    else {
      cbb_on_error(cbb);
    }
  }
  return iVar3;
}

Assistant:

static int cbb_add_u(CBB *cbb, uint64_t v, size_t len_len) {
  uint8_t *buf;
  if (!CBB_add_space(cbb, &buf, len_len)) {
    return 0;
  }

  for (size_t i = len_len - 1; i < len_len; i--) {
    buf[i] = v;
    v >>= 8;
  }

  // |v| must fit in |len_len| bytes.
  if (v != 0) {
    cbb_on_error(cbb);
    return 0;
  }

  return 1;
}